

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

Object * __thiscall
Engine::executeLocalFunction(Engine *this,uint functionName,Object **args,uint argc)

{
  LocalFunction *this_00;
  CallArgs *this_01;
  Variable *this_02;
  Object *pOVar1;
  runtime_error *this_03;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  ulong uVar2;
  
  if (functionName < this->localFunctionsCount) {
    this_01 = (CallArgs *)operator_new(0x38);
    CallArgs::CallArgs(this_01,LOCAL);
    this_00 = this->localFunctions[functionName];
    for (uVar2 = 0; uVar2 < this_00->argsCount; uVar2 = uVar2 + 1) {
      this_02 = (Variable *)operator_new(0x10);
      Variable::Variable(this_02,args[uVar2]);
      CallArgs::setVariable(this_01,this_00->args[uVar2],this_02);
    }
    addToCallStack(this,this_01);
    pOVar1 = LocalFunction::execute(this_00,this);
    removeFromCallStack(this);
    if (args != (Object **)0x0) {
      operator_delete__(args);
    }
    return pOVar1;
  }
  this_03 = (runtime_error *)
            __cxa_allocate_exception
                      (0x10,CONCAT44(in_register_00000034,functionName),args,
                       CONCAT44(in_register_0000000c,argc));
  std::runtime_error::runtime_error(this_03,"Engine::executeLocalFunction => out of range!");
  __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Object* Engine::executeLocalFunction(unsigned int functionName, Object** args, unsigned int argc) {
	if (functionName < 0 || functionName >= this->localFunctionsCount) {
		throw std::runtime_error("Engine::executeLocalFunction => out of range!");
	}
	CallArgs* callArgs = new CallArgs(LOCAL);
	LocalFunction* localFunction = this->localFunctions[functionName];
	unsigned int i;
	for (i = 0; i < localFunction->argsCount; i++) {
		Variable* variable = new Variable(args[i]);
		callArgs->setVariable(localFunction->args[i], variable);
	}
	addToCallStack(callArgs);
	Object* result = localFunction->execute(this);
	removeFromCallStack();
	delete[] args;
	
	return result;
}